

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDynamicLoader.cxx
# Opt level: O0

cmDynamicLoaderCache * cmDynamicLoaderCache::GetInstance(void)

{
  cmDynamicLoaderCache *this;
  
  if (Instance == (cmDynamicLoaderCache *)0x0) {
    this = (cmDynamicLoaderCache *)operator_new(0x30);
    cmDynamicLoaderCache(this);
    Instance = this;
  }
  return Instance;
}

Assistant:

cmDynamicLoaderCache* cmDynamicLoaderCache::GetInstance()
{
  if ( !cmDynamicLoaderCache::Instance )
    {
    cmDynamicLoaderCache::Instance = new cmDynamicLoaderCache;
    }
  return cmDynamicLoaderCache::Instance;
}